

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O3

void __thiscall
btSpatialTransformationMatrix::transform<btSpatialMotionVector>
          (btSpatialTransformationMatrix *this,btSpatialMotionVector *inVec,
          btSpatialMotionVector *outVec,eOutputOperation outOp)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  if (outOp == Subtract) {
    fVar1 = (inVec->m_topVec).m_floats[0];
    fVar2 = (inVec->m_topVec).m_floats[1];
    fVar3 = (inVec->m_topVec).m_floats[2];
    fVar4 = (this->m_rotMat).m_el[2].m_floats[1];
    fVar9 = (this->m_rotMat).m_el[2].m_floats[0];
    fVar11 = (this->m_rotMat).m_el[2].m_floats[2];
    uVar5 = *(undefined8 *)(outVec->m_topVec).m_floats;
    fVar13 = (float)uVar5 -
             (fVar3 * (this->m_rotMat).m_el[0].m_floats[2] +
             fVar1 * (this->m_rotMat).m_el[0].m_floats[0] +
             (this->m_rotMat).m_el[0].m_floats[1] * fVar2);
    fVar14 = (float)((ulong)uVar5 >> 0x20) -
             (fVar3 * (this->m_rotMat).m_el[1].m_floats[2] +
             fVar1 * (this->m_rotMat).m_el[1].m_floats[0] +
             (this->m_rotMat).m_el[1].m_floats[1] * fVar2);
    *(ulong *)(outVec->m_topVec).m_floats = CONCAT44(fVar14,fVar13);
    fVar10 = (outVec->m_topVec).m_floats[2] - (fVar11 * fVar3 + fVar9 * fVar1 + fVar4 * fVar2);
    (outVec->m_topVec).m_floats[2] = fVar10;
    fVar1 = (this->m_trnVec).m_floats[0];
    fVar2 = (inVec->m_bottomVec).m_floats[0];
    fVar3 = (inVec->m_bottomVec).m_floats[1];
    fVar4 = (inVec->m_bottomVec).m_floats[2];
    fVar9 = (this->m_rotMat).m_el[2].m_floats[1];
    fVar11 = (this->m_rotMat).m_el[2].m_floats[0];
    fVar12 = (this->m_rotMat).m_el[2].m_floats[2];
    uVar5 = *(undefined8 *)((this->m_trnVec).m_floats + 1);
    fVar15 = (float)uVar5;
    fVar16 = (float)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)(outVec->m_bottomVec).m_floats;
    *(ulong *)(outVec->m_bottomVec).m_floats =
         CONCAT44((float)((ulong)uVar5 >> 0x20) -
                  ((fVar4 * (this->m_rotMat).m_el[1].m_floats[2] +
                   fVar2 * (this->m_rotMat).m_el[1].m_floats[0] +
                   (this->m_rotMat).m_el[1].m_floats[1] * fVar3) -
                  (fVar13 * fVar16 - fVar10 * fVar1)),
                  (float)uVar5 -
                  ((fVar4 * (this->m_rotMat).m_el[0].m_floats[2] +
                   fVar2 * (this->m_rotMat).m_el[0].m_floats[0] +
                   (this->m_rotMat).m_el[0].m_floats[1] * fVar3) -
                  (fVar10 * fVar15 - fVar14 * fVar16)));
    (outVec->m_bottomVec).m_floats[2] =
         (outVec->m_bottomVec).m_floats[2] -
         ((fVar12 * fVar4 + fVar11 * fVar2 + fVar9 * fVar3) - (fVar14 * fVar1 - fVar13 * fVar15));
  }
  else {
    if (outOp == Add) {
      fVar1 = (inVec->m_topVec).m_floats[0];
      fVar2 = (inVec->m_topVec).m_floats[1];
      fVar3 = (inVec->m_topVec).m_floats[2];
      fVar4 = (this->m_rotMat).m_el[2].m_floats[1];
      fVar9 = (this->m_rotMat).m_el[2].m_floats[0];
      fVar11 = (this->m_rotMat).m_el[2].m_floats[2];
      uVar5 = *(undefined8 *)(outVec->m_topVec).m_floats;
      fVar13 = (float)uVar5 +
               fVar3 * (this->m_rotMat).m_el[0].m_floats[2] +
               fVar1 * (this->m_rotMat).m_el[0].m_floats[0] +
               (this->m_rotMat).m_el[0].m_floats[1] * fVar2;
      fVar14 = (float)((ulong)uVar5 >> 0x20) +
               fVar3 * (this->m_rotMat).m_el[1].m_floats[2] +
               fVar1 * (this->m_rotMat).m_el[1].m_floats[0] +
               (this->m_rotMat).m_el[1].m_floats[1] * fVar2;
      uVar5 = *(undefined8 *)(outVec->m_bottomVec).m_floats;
      *(ulong *)(outVec->m_topVec).m_floats = CONCAT44(fVar14,fVar13);
      fVar10 = fVar11 * fVar3 + fVar9 * fVar1 + fVar4 * fVar2 + (outVec->m_topVec).m_floats[2];
      (outVec->m_topVec).m_floats[2] = fVar10;
      fVar1 = (this->m_trnVec).m_floats[0];
      fVar2 = (inVec->m_bottomVec).m_floats[0];
      fVar3 = (inVec->m_bottomVec).m_floats[1];
      fVar4 = (inVec->m_bottomVec).m_floats[2];
      fVar9 = (this->m_rotMat).m_el[2].m_floats[1];
      fVar11 = (this->m_rotMat).m_el[2].m_floats[0];
      fVar12 = (this->m_rotMat).m_el[2].m_floats[2];
      uVar6 = *(undefined8 *)((this->m_trnVec).m_floats + 1);
      fVar15 = (float)uVar6;
      fVar16 = (float)((ulong)uVar6 >> 0x20);
      *(ulong *)(outVec->m_bottomVec).m_floats =
           CONCAT44(((fVar4 * (this->m_rotMat).m_el[1].m_floats[2] +
                     fVar2 * (this->m_rotMat).m_el[1].m_floats[0] +
                     (this->m_rotMat).m_el[1].m_floats[1] * fVar3) -
                    (fVar13 * fVar16 - fVar10 * fVar1)) + (float)((ulong)uVar5 >> 0x20),
                    ((fVar4 * (this->m_rotMat).m_el[0].m_floats[2] +
                     fVar2 * (this->m_rotMat).m_el[0].m_floats[0] +
                     (this->m_rotMat).m_el[0].m_floats[1] * fVar3) -
                    (fVar10 * fVar15 - fVar14 * fVar16)) + (float)uVar5);
      (outVec->m_bottomVec).m_floats[2] =
           ((fVar12 * fVar4 + fVar11 * fVar2 + fVar9 * fVar3) - (fVar14 * fVar1 - fVar13 * fVar15))
           + (outVec->m_bottomVec).m_floats[2];
      return;
    }
    if (outOp == None) {
      fVar1 = (inVec->m_topVec).m_floats[0];
      fVar2 = (inVec->m_topVec).m_floats[1];
      fVar3 = (inVec->m_topVec).m_floats[2];
      fVar11 = fVar3 * (this->m_rotMat).m_el[0].m_floats[2] +
               fVar1 * (this->m_rotMat).m_el[0].m_floats[0] +
               (this->m_rotMat).m_el[0].m_floats[1] * fVar2;
      fVar12 = fVar3 * (this->m_rotMat).m_el[1].m_floats[2] +
               fVar1 * (this->m_rotMat).m_el[1].m_floats[0] +
               (this->m_rotMat).m_el[1].m_floats[1] * fVar2;
      fVar9 = fVar3 * (this->m_rotMat).m_el[2].m_floats[2] +
              fVar1 * (this->m_rotMat).m_el[2].m_floats[0] +
              fVar2 * (this->m_rotMat).m_el[2].m_floats[1];
      auVar7._4_4_ = fVar12;
      auVar7._0_4_ = fVar11;
      auVar7._8_4_ = fVar9;
      auVar7._12_4_ = 0;
      *(undefined1 (*) [16])(outVec->m_topVec).m_floats = auVar7;
      fVar1 = (this->m_trnVec).m_floats[0];
      fVar2 = (inVec->m_bottomVec).m_floats[0];
      fVar3 = (inVec->m_bottomVec).m_floats[1];
      fVar4 = (inVec->m_bottomVec).m_floats[2];
      uVar5 = *(undefined8 *)((this->m_trnVec).m_floats + 1);
      fVar10 = (float)uVar5;
      fVar13 = (float)((ulong)uVar5 >> 0x20);
      auVar8._4_4_ = (fVar4 * (this->m_rotMat).m_el[1].m_floats[2] +
                     fVar2 * (this->m_rotMat).m_el[1].m_floats[0] +
                     (this->m_rotMat).m_el[1].m_floats[1] * fVar3) -
                     (fVar11 * fVar13 - fVar9 * fVar1);
      auVar8._0_4_ = (fVar4 * (this->m_rotMat).m_el[0].m_floats[2] +
                     fVar2 * (this->m_rotMat).m_el[0].m_floats[0] +
                     (this->m_rotMat).m_el[0].m_floats[1] * fVar3) -
                     (fVar9 * fVar10 - fVar12 * fVar13);
      auVar8._8_4_ = ((this->m_rotMat).m_el[2].m_floats[2] * fVar4 +
                     (this->m_rotMat).m_el[2].m_floats[0] * fVar2 +
                     (this->m_rotMat).m_el[2].m_floats[1] * fVar3) -
                     (fVar12 * fVar1 - fVar11 * fVar10);
      auVar8._12_4_ = 0;
      *(undefined1 (*) [16])(outVec->m_bottomVec).m_floats = auVar8;
      return;
    }
  }
  return;
}

Assistant:

void transform(	const SpatialVectorType &inVec,
                      SpatialVectorType &outVec,
					eOutputOperation outOp = None)
	{
		if(outOp == None)
		{
			outVec.m_topVec = m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec = -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		else if(outOp == Add)
		{
			outVec.m_topVec += m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec += -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		else if(outOp == Subtract)
		{
			outVec.m_topVec -= m_rotMat * inVec.m_topVec;
			outVec.m_bottomVec -= -m_trnVec.cross(outVec.m_topVec) + m_rotMat * inVec.m_bottomVec;
		}
		
	}